

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O2

RDL_graph * RDL_initNewGraph_g(uint V,char owns_edges)

{
  RDL_graph *pRVar1;
  uint *puVar2;
  ulong uVar3;
  RDL_edge **ppaRVar4;
  RDL_edge *paRVar5;
  uint **ppuVar6;
  uint uVar7;
  ulong uVar8;
  
  pRVar1 = (RDL_graph *)malloc(0x28);
  uVar8 = (ulong)V;
  puVar2 = (uint *)malloc(uVar8 * 4);
  for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
    puVar2[uVar3] = 0;
  }
  pRVar1->V = V;
  pRVar1->E = 0;
  pRVar1->degree = puVar2;
  ppaRVar4 = (RDL_edge **)malloc(uVar8 * 8);
  for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
    if ((ulong)puVar2[uVar3] != 0) {
      paRVar5 = (RDL_edge *)malloc((ulong)puVar2[uVar3] << 3);
      ppaRVar4[uVar3] = paRVar5;
    }
  }
  pRVar1->adjList = ppaRVar4;
  if (owns_edges == '\0') {
    uVar7 = 0;
    ppuVar6 = (uint **)0x0;
  }
  else {
    ppuVar6 = (uint **)malloc(0x200);
    uVar7 = 0x40;
  }
  pRVar1->edgesAlloced = uVar7;
  pRVar1->edges = ppuVar6;
  return pRVar1;
}

Assistant:

RDL_graph *RDL_initNewGraph_g(unsigned V, char owns_edges)
{
  RDL_graph *graph = malloc(sizeof(*graph));
  unsigned *degree;
  unsigned i;
  degree = malloc(V * sizeof(*degree));
  for(i=0; i<V; ++i)
  {
    degree[i] = 0;
  }
  RDL_initGraph(graph,V,degree,owns_edges);

  return graph;
}